

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O3

vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *
LiteScript::Script::GetInstructionList
          (vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
           *__return_storage_ptr__,char *code,ErrorType *err,uint *line_err,uint *col_error)

{
  int iVar1;
  ulong uVar2;
  char *data;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  String str;
  String local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = Syntax::ReadScript((Syntax *)code,(char *)__return_storage_ptr__,
                             (vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                              *)err,line_err);
  if (iVar1 < 0) {
    uVar6 = -iVar1;
    uVar2 = 1;
    if (1 < (int)uVar6) {
      uVar2 = (ulong)uVar6;
    }
    *line_err = 0;
    uVar3 = 0;
    uVar5 = 0;
    uVar4 = 0;
    do {
      if (code[uVar3] == '\n') {
        uVar4 = uVar4 + 1;
        *line_err = uVar4;
        uVar5 = uVar3 + 1 & 0xffffffff;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != uVar2);
    iVar7 = uVar6 - (int)uVar5;
    iVar1 = -1;
    if (-2 < iVar7) {
      iVar1 = iVar7 + 1;
    }
    data = (char *)operator_new__((long)iVar1);
    memcpy(data,code + (int)uVar5,(long)iVar7);
    data[iVar7] = '\0';
    String::String(&local_50,data);
    uVar6 = String::GetLength(&local_50);
    *col_error = uVar6;
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_50.str._M_dataplus._M_p != &local_50.str.field_2) {
      operator_delete(local_50.str._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<LiteScript::Instruction> LiteScript::Script::GetInstructionList(const char *code, Script::ErrorType &err,
                                                                            unsigned int &line_err,
                                                                            unsigned int &col_error) {
    std::vector<Instruction> list;
    int tmp;
    if ((tmp = LiteScript::Syntax::ReadScript(code, list, err)) < 0) {
        line_err = 0;
        tmp = -tmp;
        int sv = 0;
        for (int i = 0; i < tmp; i++) {
            if (code[i] == '\n') {
                line_err++;
                sv = i + 1;
            }
        }
        int len = tmp - sv;
        char * tmp_s = new char[len + 1];
        memcpy(tmp_s, code + sv, (size_t)len);
        tmp_s[len] = '\0';
        String str(tmp_s);
        col_error = str.GetLength();
    }
    return list;
}